

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O0

ByteMaskType * __thiscall
hexpattern::decodechunk(ByteMaskType *__return_storage_ptr__,hexpattern *this,string *chunk)

{
  char c_00;
  pointer this_00;
  bool bVar1;
  int iVar2;
  reference pcVar3;
  int nyble_1;
  int nyble;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  undefined1 local_58 [6];
  bool hi;
  uint8_t maskvalue;
  ByteVector mask;
  undefined1 local_38 [7];
  uint8_t datavalue;
  ByteVector data;
  string *chunk_local;
  hexpattern *this_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)chunk;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  this_00 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  __range1._7_1_ = 0;
  __range1._6_1_ = 1;
  __end1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  _nyble = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  while (bVar1 = __gnu_cxx::
                 operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&nyble), ((bVar1 ^ 0xffU) & 1) != 0) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    c_00 = *pcVar3;
    iVar2 = convertnyble(c_00);
    if (iVar2 != -1) {
      if (iVar2 == -2) {
        if ((__range1._6_1_ & 1) != 0) {
          mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
          __range1._7_1_ = 0;
        }
      }
      else {
        iVar2 = convertnyble(c_00);
        if ((__range1._6_1_ & 1) == 0) {
          mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ =
               mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._7_1_ | (byte)iVar2;
          __range1._7_1_ = __range1._7_1_ | 0xf;
        }
        else {
          mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_ = (byte)(iVar2 << 4);
          __range1._7_1_ = 0xf0;
        }
      }
      if ((__range1._6_1_ & 1) == 0) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                   (value_type_conflict3 *)
                   ((long)&mask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58,
                   (value_type_conflict3 *)((long)&__range1 + 7));
      }
      __range1._6_1_ = (__range1._6_1_ ^ 0xff) & 1;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::
  make_pair<std::vector<unsigned_char,std::allocator<unsigned_char>>&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
            (__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

ByteMaskType decodechunk(const std::string& chunk)
    {
        ByteVector data;  uint8_t datavalue = 0;
        ByteVector mask;  uint8_t maskvalue = 0;

        bool hi = true;
        for (auto c : chunk)
        {
            int nyble = convertnyble(c);
            if (nyble == -1)
                continue;

            if (nyble == -2) {
                if (hi) {
                    datavalue = 0;
                    maskvalue = 0;
                }
            }
            else {
                int nyble = convertnyble(c);
                if (hi) {
                    datavalue = nyble << 4;
                    maskvalue = 0xF0;
                }
                else {
                    datavalue |= nyble;
                    maskvalue |= 0x0F;
                }
            }

            if (!hi) {
                data.push_back(datavalue);
                mask.push_back(maskvalue);
            }
            hi = !hi;
        }
        return std::make_pair(data, mask);
    }